

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O0

void __thiscall
TApp_RequiredAndSubcoms_Test::~TApp_RequiredAndSubcoms_Test(TApp_RequiredAndSubcoms_Test *this)

{
  TApp_RequiredAndSubcoms_Test *this_local;
  
  TApp::~TApp(&this->super_TApp);
  return;
}

Assistant:

TEST_F(TApp, RequiredAndSubcoms) { // #23

    std::string baz;
    app.add_option("baz", baz, "Baz Description", true)->required();
    auto foo = app.add_subcommand("foo");
    auto bar = app.add_subcommand("bar");

    args = {"bar", "foo"};
    EXPECT_NO_THROW(run());
    EXPECT_TRUE(*foo);
    EXPECT_FALSE(*bar);
    EXPECT_EQ(baz, "bar");

    app.reset();
    args = {"foo"};
    EXPECT_NO_THROW(run());
    EXPECT_FALSE(*foo);
    EXPECT_EQ(baz, "foo");

    app.reset();
    args = {"foo", "foo"};
    EXPECT_NO_THROW(run());
    EXPECT_TRUE(*foo);
    EXPECT_EQ(baz, "foo");

    app.reset();
    args = {"foo", "other"};
    EXPECT_THROW(run(), CLI::ExtrasError);
}